

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.c
# Opt level: O1

void write_global_config(char *config)

{
  long lVar1;
  char buf [32];
  char acStack_48 [32];
  
  lVar1 = al_load_config_file();
  if (lVar1 == 0) {
    lVar1 = al_create_config();
  }
  sprintf(acStack_48,"%d",(ulong)(uint)fullscreen);
  al_set_config_value(lVar1,"GFX","fullscreen",acStack_48);
  sprintf(acStack_48,"%d",(ulong)(uint)bit_depth);
  al_set_config_value(lVar1,"GFX","bit_depth",acStack_48);
  sprintf(acStack_48,"%d",(ulong)(uint)screen_width);
  al_set_config_value(lVar1,"GFX","screen_width",acStack_48);
  sprintf(acStack_48,"%d",(ulong)(uint)screen_height);
  al_set_config_value(lVar1,"GFX","screen_height",acStack_48);
  sprintf(acStack_48,"%d",(ulong)(uint)window_width);
  al_set_config_value(lVar1,"GFX","window_width",acStack_48);
  sprintf(acStack_48,"%d",(ulong)(uint)window_height);
  al_set_config_value(lVar1,"GFX","window_height",acStack_48);
  sprintf(acStack_48,"%d",(ulong)(uint)screen_samples);
  al_set_config_value(lVar1,"GFX","samples",acStack_48);
  sprintf(acStack_48,"%d",(ulong)(uint)use_vsync);
  al_set_config_value(lVar1,"GFX","vsync",acStack_48);
  sprintf(acStack_48,"%d",(ulong)(uint)logic_framerate);
  al_set_config_value(lVar1,"TIMING","logic_framerate",acStack_48);
  sprintf(acStack_48,"%d",(ulong)(uint)max_frame_skip);
  al_set_config_value(lVar1,"TIMING","max_frame_skip",acStack_48);
  sprintf(acStack_48,"%d",(ulong)(uint)limit_framerate);
  al_set_config_value(lVar1,"TIMING","limit_framerate",acStack_48);
  sprintf(acStack_48,"%d",(ulong)(uint)display_framerate);
  al_set_config_value(lVar1,"TIMING","display_framerate",acStack_48);
  sprintf(acStack_48,"%d",(ulong)(uint)reduce_cpu_usage);
  al_set_config_value(lVar1,"TIMING","reduce_cpu_usage",acStack_48);
  sprintf(acStack_48,"%d",(ulong)(uint)sound_volume);
  al_set_config_value(lVar1,"SOUND","sound_volume",acStack_48);
  sprintf(acStack_48,"%d",(ulong)(uint)music_volume);
  al_set_config_value(lVar1,"SOUND","music_volume",acStack_48);
  sprintf(acStack_48,"%d",(ulong)(uint)controller_id);
  al_set_config_value(lVar1,"CONTROLS","controller_id",acStack_48);
  al_save_config_file(config,lVar1);
  al_destroy_config(lVar1);
  return;
}

Assistant:

void write_global_config(const char *config)
{
   ALLEGRO_CONFIG *c = al_load_config_file(config);
   if (!c) c = al_create_config();

   set_config_int(c, "GFX", "fullscreen", fullscreen);
   set_config_int(c, "GFX", "bit_depth", bit_depth);
   set_config_int(c, "GFX", "screen_width", screen_width);
   set_config_int(c, "GFX", "screen_height", screen_height);
   set_config_int(c, "GFX", "window_width", window_width);
   set_config_int(c, "GFX", "window_height", window_height);
   set_config_int(c, "GFX", "samples", screen_samples);
   set_config_int(c, "GFX", "vsync", use_vsync);

   set_config_int(c, "TIMING", "logic_framerate", logic_framerate);
   set_config_int(c, "TIMING", "max_frame_skip", max_frame_skip);
   set_config_int(c, "TIMING", "limit_framerate", limit_framerate);
   set_config_int(c, "TIMING", "display_framerate", display_framerate);
   set_config_int(c, "TIMING", "reduce_cpu_usage", reduce_cpu_usage);

   set_config_int(c, "SOUND", "sound_volume", sound_volume);
   set_config_int(c, "SOUND", "music_volume", music_volume);

   set_config_int(c, "CONTROLS", "controller_id", controller_id);

   al_save_config_file(config, c);
   al_destroy_config(c);
}